

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_extra.c
# Opt level: O1

int nsync_time_sleep_until(nsync_time abs_deadline)

{
  int iVar1;
  nsync_time nVar2;
  
  nVar2 = nsync_time_now();
  iVar1 = nsync_time_cmp(abs_deadline,nVar2);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    nVar2 = nsync_time_sub(abs_deadline,nVar2);
    nVar2 = nsync_time_sleep(nVar2);
    iVar1 = nsync_time_cmp(nVar2,(nsync_time)ZEXT816((ulong)0));
    iVar1 = (uint)(0 < iVar1) << 2;
  }
  return iVar1;
}

Assistant:

int nsync_time_sleep_until (nsync_time abs_deadline) {
	int result = 0;
	nsync_time now;
	now = nsync_time_now ();
	if (nsync_time_cmp (abs_deadline, now) > 0) {
		nsync_time remaining;
		remaining = nsync_time_sleep (nsync_time_sub (abs_deadline, now));
		if (nsync_time_cmp (remaining, nsync_time_zero) > 0) {
			result = EINTR;
		}
	}
	return (result);
}